

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnly(int *argc,char **argv)

{
  int iVar1;
  bool bVar2;
  char **in_RDX;
  char **extraout_RDX;
  _Alloc_hider path;
  string *str;
  int iVar3;
  long lVar4;
  string sStack_50;
  
  iVar3 = 1;
  str = (string *)argc;
  do {
    if (*argc <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str);
      }
      return;
    }
    lVar4 = (long)iVar3;
    StreamableToString<char*>(&sStack_50,(internal *)(argv + lVar4),in_RDX);
    path._M_p = sStack_50._M_dataplus._M_p;
    bVar2 = ParseGoogleTestFlag(sStack_50._M_dataplus._M_p);
    if (bVar2) {
LAB_0015521c:
      iVar1 = *argc;
      for (; iVar1 != lVar4; lVar4 = lVar4 + 1) {
        argv[lVar4] = argv[lVar4 + 1];
      }
      *argc = iVar1 + -1;
      iVar3 = iVar3 + -1;
    }
    else {
      bVar2 = ParseStringFlag<std::__cxx11::string>
                        (path._M_p,"flagfile",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &FLAGS_gtest_flagfile_abi_cxx11_);
      if (bVar2) {
        LoadFlagsFromFile((string *)path._M_p);
        goto LAB_0015521c;
      }
      bVar2 = std::operator==(&sStack_50,"--help");
      if (bVar2) {
LAB_00155294:
        g_help_flag = '\x01';
      }
      else {
        bVar2 = std::operator==(&sStack_50,"-h");
        if (bVar2) goto LAB_00155294;
        bVar2 = std::operator==(&sStack_50,"-?");
        if (bVar2) goto LAB_00155294;
        bVar2 = std::operator==(&sStack_50,"/?");
        if (bVar2) goto LAB_00155294;
        bVar2 = HasGoogleTestFlagPrefix((char *)0x155290);
        if (bVar2) goto LAB_00155294;
      }
    }
    str = &sStack_50;
    std::__cxx11::string::~string((string *)&sStack_50);
    iVar3 = iVar3 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnly(int* argc, char** argv) {
  ParseGoogleTestFlagsOnlyImpl(argc, argv);

  // Fix the value of *_NSGetArgc() on macOS, but if and only if
  // *_NSGetArgv() == argv
  // Only applicable to char** version of argv
#if GTEST_OS_MAC
#ifndef GTEST_OS_IOS
  if (*_NSGetArgv() == argv) {
    *_NSGetArgc() = *argc;
  }
#endif
#endif
}